

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O2

Node * __thiscall
mapbox::detail::Earcut<unsigned_int>::findHoleBridge
          (Earcut<unsigned_int> *this,Node *hole,Node *outerNode)

{
  double dVar1;
  double ay;
  double dVar2;
  double dVar3;
  bool bVar4;
  Node *pNVar5;
  Node *pNVar6;
  Node *pNVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double local_90;
  
  dVar1 = hole->x;
  ay = hole->y;
  dVar10 = -INFINITY;
  pNVar7 = (Node *)0x0;
  pNVar5 = outerNode;
  do {
    dVar8 = pNVar5->y;
    pNVar6 = pNVar5->next;
    if ((ay <= dVar8) && (dVar11 = pNVar6->y, dVar11 <= ay)) {
      if ((dVar11 != dVar8) || (NAN(dVar11) || NAN(dVar8))) {
        dVar2 = pNVar5->x;
        dVar8 = ((pNVar6->x - dVar2) * (ay - dVar8)) / (dVar11 - dVar8) + dVar2;
        if ((dVar8 <= dVar1) && (dVar10 < dVar8)) {
          pNVar7 = pNVar5;
          if (pNVar6->x <= dVar2) {
            pNVar7 = pNVar6;
          }
          dVar10 = dVar8;
          if ((dVar8 == dVar1) && (!NAN(dVar8) && !NAN(dVar1))) {
            return pNVar7;
          }
        }
      }
    }
    pNVar5 = pNVar6;
  } while (pNVar6 != outerNode);
  if (pNVar7 == (Node *)0x0) {
    pNVar5 = (Node *)0x0;
  }
  else {
    dVar8 = pNVar7->y;
    dVar11 = dVar10;
    if (dVar8 <= ay) {
      dVar11 = dVar1;
    }
    dVar2 = pNVar7->x;
    local_90 = INFINITY;
    pNVar6 = pNVar7;
    pNVar5 = pNVar7;
    do {
      dVar9 = pNVar6->x;
      if ((((dVar1 != dVar9) || (NAN(dVar1) || NAN(dVar9))) && (dVar9 <= dVar1)) &&
         ((dVar2 <= dVar9 &&
          (bVar4 = pointInTriangle(this,(double)(~-(ulong)(ay < dVar8) & (ulong)dVar10 |
                                                -(ulong)(ay < dVar8) & (ulong)dVar1),ay,dVar2,dVar8,
                                   dVar11,ay,dVar9,pNVar6->y), bVar4)))) {
        dVar9 = pNVar6->y;
        dVar3 = pNVar6->x;
        bVar4 = locallyInside(this,pNVar6,hole);
        if (bVar4) {
          dVar9 = ABS(ay - dVar9) / (dVar1 - dVar3);
          if (local_90 <= dVar9) {
            if (((dVar9 != local_90) || (NAN(dVar9) || NAN(local_90))) ||
               ((pNVar6->x < pNVar5->x || pNVar6->x == pNVar5->x &&
                (bVar4 = sectorContainsSector(this,pNVar5,pNVar6), !bVar4)))) goto LAB_002c8b1c;
          }
          pNVar5 = pNVar6;
          local_90 = dVar9;
        }
      }
LAB_002c8b1c:
      pNVar6 = pNVar6->next;
    } while (pNVar6 != pNVar7);
  }
  return pNVar5;
}

Assistant:

typename Earcut<N>::Node*
Earcut<N>::findHoleBridge(Node* hole, Node* outerNode) {
    Node* p = outerNode;
    double hx = hole->x;
    double hy = hole->y;
    double qx = -std::numeric_limits<double>::infinity();
    Node* m = nullptr;

    // find a segment intersected by a ray from the hole's leftmost Vertex to the left;
    // segment's endpoint with lesser x will be potential connection Vertex
    do {
        if (hy <= p->y && hy >= p->next->y && p->next->y != p->y) {
          double x = p->x + (hy - p->y) * (p->next->x - p->x) / (p->next->y - p->y);
          if (x <= hx && x > qx) {
            qx = x;
            m = p->x < p->next->x ? p : p->next;
            if (x == hx) return m; // hole touches outer segment; pick leftmost endpoint
          }
        }
        p = p->next;
    } while (p != outerNode);

    if (!m) return 0;

    // look for points inside the triangle of hole Vertex, segment intersection and endpoint;
    // if there are no points found, we have a valid connection;
    // otherwise choose the Vertex of the minimum angle with the ray as connection Vertex

    const Node* stop = m;
    double tanMin = std::numeric_limits<double>::infinity();
    double tanCur = 0;

    p = m;
    double mx = m->x;
    double my = m->y;

    do {
        if (hx >= p->x && p->x >= mx && hx != p->x &&
            pointInTriangle(hy < my ? hx : qx, hy, mx, my, hy < my ? qx : hx, hy, p->x, p->y)) {

            tanCur = std::abs(hy - p->y) / (hx - p->x); // tangential

            if (locallyInside(p, hole) &&
                (tanCur < tanMin || (tanCur == tanMin && (p->x > m->x || sectorContainsSector(m, p))))) {
                m = p;
                tanMin = tanCur;
            }
        }

        p = p->next;
    } while (p != stop);

    return m;
}